

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

bool deqp::gls::anon_unknown_1::outputTypeIsIntType(OutputType type)

{
  undefined1 local_9;
  OutputType type_local;
  
  if ((((type == OUTPUTTYPE_INT) || (type == OUTPUTTYPE_IVEC2)) || (type == OUTPUTTYPE_IVEC3)) ||
     (type == OUTPUTTYPE_IVEC4)) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

static bool outputTypeIsIntType (DrawTestSpec::OutputType type)
{
	if (type == DrawTestSpec::OUTPUTTYPE_INT
		|| type == DrawTestSpec::OUTPUTTYPE_IVEC2
		|| type == DrawTestSpec::OUTPUTTYPE_IVEC3
		|| type == DrawTestSpec::OUTPUTTYPE_IVEC4)
		return true;

	return false;
}